

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgetresizehandler_p.cpp
# Opt level: O0

void QWidgetResizeHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QWidgetResizeHandler *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    activate((QWidgetResizeHandler *)0x66b24f);
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QWidgetResizeHandler::*)()>(in_RCX,(void **)activate,0,0);
  }
  return;
}

Assistant:

void QWidgetResizeHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetResizeHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activate(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidgetResizeHandler::*)()>(_a, &QWidgetResizeHandler::activate, 0))
            return;
    }
}